

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

QueueType * __thiscall
slang::BumpAllocator::emplace<slang::ast::QueueType,slang::ast::TypeAliasType&,unsigned_int>
          (BumpAllocator *this,TypeAliasType *args,uint *args_1)

{
  QueueType *this_00;
  
  this_00 = (QueueType *)allocate(this,0x58,8);
  ast::QueueType::QueueType(this_00,&args->super_Type,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }